

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O2

void __thiscall
SStringViewRelational_Lt_Test<const_char_*>::~SStringViewRelational_Lt_Test
          (SStringViewRelational_Lt_Test<const_char_*> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewRelational, Lt) {
#define LT(lhs, rhs, x, y)                                                                         \
    do {                                                                                           \
        auto const lhs_view = pstore::make_sstring_view ((lhs), std::strlen (lhs));                \
        EXPECT_EQ ((lhs_view < rhs), bool{(x)});                                                   \
        EXPECT_EQ ((rhs < lhs_view), bool{(y)});                                                   \
    } while (0)
    LT ("", TypeParam (""), false, false);
    LT ("", TypeParam ("abcde"), true, false);
    LT ("", TypeParam ("abcdefghij"), true, false);
    LT ("", TypeParam ("abcdefghijklmnopqrst"), true, false);
    LT ("abcde", TypeParam (""), false, true);
    LT ("abcde", TypeParam ("abcde"), false, false);
    LT ("abcde", TypeParam ("abcdefghij"), true, false);
    LT ("abcde", TypeParam ("abcdefghijklmnopqrst"), true, false);
    LT ("abcdefghij", TypeParam (""), false, true);
    LT ("abcdefghij", TypeParam ("abcde"), false, true);
    LT ("abcdefghij", TypeParam ("abcdefghij"), false, false);
    LT ("abcdefghij", TypeParam ("abcdefghijklmnopqrst"), true, false);
    LT ("abcdefghijklmnopqrst", TypeParam (""), false, true);
    LT ("abcdefghijklmnopqrst", TypeParam ("abcde"), false, true);
    LT ("abcdefghijklmnopqrst", TypeParam ("abcdefghij"), false, true);
    LT ("abcdefghijklmnopqrst", TypeParam ("abcdefghijklmnopqrst"), false, false);
#undef LE
}